

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_composition_test.cpp
# Opt level: O0

void __thiscall
CatcherComposition_Tests::CatcherComposition_with_3_catchers_works::test_method
          (CatcherComposition_with_3_catchers_works *this)

{
  undefined7 uVar1;
  GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>
  GVar2;
  undefined1 in_R9B;
  GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>,_mittens::DefaultNoAction<std::exception>_>
  GVar3;
  GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>,_mittens::DefaultNoAction<std::exception>_>
  func;
  undefined1 uStack_39;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  undefined1 local_28 [8];
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>,_mittens::DefaultNoAction<std::exception>_>,_mittens::DefaultNoAction<void>_>
  catcher;
  CatcherComposition_with_3_catchers_works *this_local;
  
  catcher._16_8_ = this;
  GVar2 = mittens::bad_alloc_handler<int>(-3);
  uVar1 = GVar2._0_7_;
  GVar2._7_1_ = uStack_39;
  GVar2.failCode_ = (int)uVar1;
  GVar2._4_2_ = (short)((uint7)uVar1 >> 0x20);
  GVar2.supressExceptionsInAction_ = (bool)(char)((uint7)uVar1 >> 0x30);
  GVar3 = mittens::
          std_exception_handler<mittens::GenericExceptionHandler<std::bad_alloc,mittens::UnHandler<int>,mittens::DefaultNoAction<std::bad_alloc>>,int>
                    (-2,GVar2,true);
  uStack_30 = GVar3._8_6_;
  func.nestedHandler.failCode_._2_2_ = uStack_2a;
  func._0_6_ = uStack_30;
  func.nestedHandler._4_4_ = 1;
  func._12_4_ = 0;
  mittens::
  all_catcher<mittens::GenericExceptionHandler<std::exception,mittens::GenericExceptionHandler<std::bad_alloc,mittens::UnHandler<int>,mittens::DefaultNoAction<std::bad_alloc>>,mittens::DefaultNoAction<std::exception>>,int>
            ((GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::bad_alloc>_>,_mittens::DefaultNoAction<std::exception>_>,_mittens::DefaultNoAction<void>_>
              *)local_28,(mittens *)0xffffffff,GVar3.failCode_,func,(bool)in_R9B);
  throw_bad_alloc();
  throw_std_exception();
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CatcherComposition_with_3_catchers_works)
{
   auto catcher = all_catcher(-1, std_exception_handler(-2, bad_alloc_handler(-3))); // external handler

   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-3, catcher.handleException());
   }

   try
   {
      throw_std_exception();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-2, catcher.handleException());
   }

   try
   {
      throw_int();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(-1, catcher.handleException());
   }
}